

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_59::InMemoryFile::read(InMemoryFile *this,int __fd,void *__buf,size_t __nbytes)

{
  Exception *pEVar1;
  ulong __n;
  undefined4 in_register_00000034;
  Exception *pEVar2;
  Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  Maybe<kj::_::Mutex::Waiter_&> local_28;
  
  pEVar2 = (Exception *)CONCAT44(in_register_00000034,__fd);
  MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl>::lockShared
            ((MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *)&stack0xffffffffffffffd0
             ,&this->impl);
  pEVar1 = ((local_28.ptr)->exception).ptr.ptr;
  __n = (long)pEVar1 - (long)pEVar2;
  if (pEVar1 < pEVar2 || __n == 0) {
    __n = 0;
  }
  else {
    if (__nbytes < __n) {
      __n = __nbytes;
    }
    memcpy(__buf,(void *)((long)&(local_28.ptr)->prev[-0xd].ptr + (long)pEVar2->trace),__n);
  }
  Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked
            ((Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl> *)&stack0xffffffffffffffd0
            );
  return __n;
}

Assistant:

size_t read(uint64_t offset, ArrayPtr<byte> buffer) const override {
    auto lock = impl.lockShared();
    if (offset >= lock->size) {
      // Entirely out-of-range.
      return 0;
    }

    size_t readSize = kj::min(buffer.size(), lock->size - offset);
    memcpy(buffer.begin(), lock->bytes.begin() + offset, readSize);
    return readSize;
  }